

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.cpp
# Opt level: O0

void __thiscall DatUnpacker::Exception::Exception(Exception *this,string *message)

{
  string *message_local;
  Exception *this_local;
  
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__Exception_0011d730;
  std::__cxx11::string::string((string *)&this->_message,(string *)message);
  return;
}

Assistant:

Exception::Exception(const std::string& message) : _message(message)
    {
    }